

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O3

ssize_t ws_client_collect(uchar *buf,size_t buflen,int frame_age,int frame_flags,
                         curl_off_t payload_offset,curl_off_t payload_len,void *userp,CURLcode *err)

{
  long lVar1;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  Curl_easy *data;
  ulong local_30;
  
  lVar1 = *(long *)((long)userp + 0x18);
  if (lVar1 == 0) {
    *(int *)((long)userp + 0x20) = frame_age;
    *(int *)((long)userp + 0x24) = frame_flags;
    *(curl_off_t *)((long)userp + 0x28) = payload_offset;
    *(curl_off_t *)((long)userp + 0x30) = payload_len;
  }
  if (payload_offset + buflen == payload_len && (frame_flags & 0x10U) != 0) {
    data = *userp;
    if (data == (Curl_easy *)0x0) {
      data = (CURL *)0x0;
    }
    else if ((((data->set).field_0x8cd & 0x10) != 0) &&
            ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ))) {
      Curl_infof(data,"WS: auto-respond to PING with a PONG");
      data = *userp;
    }
    CVar3 = curl_ws_send(data,buf,buflen,&local_30,0,0x40);
    *err = CVar3;
    local_30 = -(ulong)(CVar3 != CURLE_OK) | local_30;
  }
  else {
    *(undefined1 *)((long)userp + 0x38) = 1;
    local_30 = *(long *)((long)userp + 0x10) - lVar1;
    if (buflen <= local_30) {
      local_30 = buflen;
    }
    if (local_30 == 0) {
      if (buflen == 0) {
        *err = CURLE_OK;
        local_30 = 0;
      }
      else {
        *err = CURLE_AGAIN;
        local_30 = 0xffffffffffffffff;
      }
    }
    else {
      *err = CURLE_OK;
      memcpy((void *)(lVar1 + *(long *)((long)userp + 8)),buf,local_30);
      *(long *)((long)userp + 0x18) = *(long *)((long)userp + 0x18) + local_30;
    }
  }
  return local_30;
}

Assistant:

static ssize_t ws_client_collect(const unsigned char *buf, size_t buflen,
                                 int frame_age, int frame_flags,
                                 curl_off_t payload_offset,
                                 curl_off_t payload_len,
                                 void *userp,
                                 CURLcode *err)
{
  struct ws_collect *ctx = userp;
  size_t nwritten;
  curl_off_t remain = (payload_len - (payload_offset + buflen));

  if(!ctx->bufidx) {
    /* first write */
    ctx->frame_age = frame_age;
    ctx->frame_flags = frame_flags;
    ctx->payload_offset = payload_offset;
    ctx->payload_len = payload_len;
  }

  if((frame_flags & CURLWS_PING) && !remain) {
    /* auto-respond to PINGs, only works for single-frame payloads atm */
    size_t bytes;
    infof(ctx->data, "WS: auto-respond to PING with a PONG");
    /* send back the exact same content as a PONG */
    *err = curl_ws_send(ctx->data, buf, buflen, &bytes, 0, CURLWS_PONG);
    if(*err)
      return -1;
    nwritten = bytes;
  }
  else {
    ctx->written = TRUE;
    DEBUGASSERT(ctx->buflen >= ctx->bufidx);
    nwritten = CURLMIN(buflen, ctx->buflen - ctx->bufidx);
    if(!nwritten) {
      if(!buflen) {  /* 0 length write, we accept that */
        *err = CURLE_OK;
        return 0;
      }
      *err = CURLE_AGAIN;  /* no more space */
      return -1;
    }
    *err = CURLE_OK;
    memcpy(ctx->buffer + ctx->bufidx, buf, nwritten);
    ctx->bufidx += nwritten;
  }
  return nwritten;
}